

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O2

void __thiscall
jsoncons::jsonschema::
min_length_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
::do_validate(min_length_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
              *this)

{
  json_pointer *in_RCX;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDX;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_RSI;
  evaluation_results *in_R8;
  error_reporter *in_R9;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_stack_00000008;
  
  min_length_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::do_validate((min_length_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *)(this + *(long *)(*(long *)this + -0x38)),in_RSI,in_RDX,in_RCX,in_R8,in_R9,
                in_stack_00000008);
  return;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& /*results*/, 
            error_reporter& reporter,
            Json& /*patch*/) const final
        {
            if (!instance.is_string())
            {
                return walk_result::advance;
            }

            eval_context<Json> this_context(context, this->keyword_name());

            auto sv = instance.as_string_view();
            std::size_t length = unicode_traits::count_codepoints(sv.data(), sv.size());
            if (length < min_length_) 
            {
                walk_result result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                    std::string("Number of characters must be at least ") + std::to_string(min_length_)));
                if (result == walk_result::abort)
                {
                    return result;
                }
            }
            return walk_result::advance;
        }